

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

Int128 __thiscall btConvexHullInternal::Int128::operator*(Int128 *this,int64_t b)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t b_00;
  ulong uVar4;
  bool bVar5;
  Int128 IVar6;
  
  uVar3 = this->low;
  uVar1 = this->high;
  uVar4 = uVar1;
  if ((long)uVar1 < 0) {
    bVar5 = uVar3 == 0;
    uVar3 = -uVar3;
    uVar4 = ~uVar1 + (ulong)bVar5;
  }
  b_00 = -b;
  if (0 < b) {
    b_00 = b;
  }
  IVar6 = mul(uVar3,b_00);
  uVar2 = IVar6.low;
  uVar4 = b_00 * uVar4 + IVar6.high;
  uVar3 = uVar2;
  if ((long)(uVar1 ^ b) < 0) {
    uVar3 = -uVar2;
    uVar4 = ~uVar4 + (ulong)(uVar2 == 0);
  }
  IVar6.high = uVar4;
  IVar6.low = uVar3;
  return IVar6;
}

Assistant:

btConvexHullInternal::Int128 btConvexHullInternal::Int128::operator*(int64_t b) const
{
	bool negative = (int64_t) high < 0;
	Int128 a = negative ? -*this : *this;
	if (b < 0)
	{
		negative = !negative;
		b = -b;
	}
	Int128 result = mul(a.low, (uint64_t) b);
	result.high += a.high * (uint64_t) b;
	return negative ? -result : result;
}